

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::
bindProcessName<Catch::ConfigData,std::__cxx11::string>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          field)

{
  BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  BoundArgFunction<Catch::ConfigData> local_20;
  offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18
  ;
  offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  field_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  local_18 = field;
  field_local = (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 )this;
  this_00 = (BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x10);
  Detail::
  BoundDataMember<Catch::ConfigData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::BoundDataMember(this_00,local_18);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&local_20,(IArgFunction<Catch::ConfigData> *)this_00);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=(&this->m_boundProcessName,&local_20);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_20);
  return;
}

Assistant:

void bindProcessName( M C::* field ) {
            m_boundProcessName = new Detail::BoundDataMember<C,M>( field );
        }